

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O3

string * core::image::anon_unknown_0::debug_print<float>
                   (string *__return_storage_ptr__,float *value,string *extra)

{
  long lVar1;
  string *extraout_RAX;
  long *plVar2;
  string *extraout_RAX_00;
  string *psVar3;
  size_type *psVar4;
  stringstream local_1c8 [128];
  ios_base local_148 [264];
  string *local_40 [4];
  
  if (*value <= 0.0 && *value != 0.0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<not set>","")
    ;
    return extraout_RAX;
  }
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::ostream::_M_insert<double>((double)*value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::ios_base::~ios_base(local_148);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_40,(ulong)(extra->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  psVar3 = (string *)(local_40 + 2);
  if (local_40[0] != psVar3) {
    operator_delete(local_40[0]);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

std::string
    debug_print (T const& value, std::string extra = "")
    {
        if (value < T(0))
            return "<not set>";
        else
            return util::string::get(value) + extra;
    }